

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void primaryexp(LexState *ls,expdesc *v)

{
  int iVar1;
  int line;
  expdesc *v_local;
  LexState *ls_local;
  
  iVar1 = (ls->t).token;
  if (iVar1 == 0x28) {
    iVar1 = ls->linenumber;
    luaX_next(ls);
    expr(ls,v);
    check_match(ls,0x29,0x28,iVar1);
    luaK_dischargevars(ls->fs,v);
  }
  else {
    if (iVar1 != 0x124) {
      luaX_syntaxerror(ls,"unexpected symbol");
    }
    singlevar(ls,v);
  }
  return;
}

Assistant:

static void primaryexp (LexState *ls, expdesc *v) {
  /* primaryexp -> NAME | '(' expr ')' */
  switch (ls->t.token) {
    case '(': {
      int line = ls->linenumber;
      luaX_next(ls);
      expr(ls, v);
      check_match(ls, ')', '(', line);
      luaK_dischargevars(ls->fs, v);
      return;
    }
    case TK_NAME: {
      singlevar(ls, v);
      return;
    }
    default: {
      luaX_syntaxerror(ls, "unexpected symbol");
    }
  }
}